

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result
latin1_toUtf8(ENCODING *UNUSED_enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  char *pcVar4;
  uchar c;
  char *toLim_local;
  char **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *UNUSED_enc_local;
  
  while( true ) {
    while( true ) {
      if (*fromP == fromLim) {
        return XML_CONVERT_COMPLETED;
      }
      bVar1 = **fromP;
      if ((bVar1 & 0x80) == 0) break;
      if ((long)toLim - (long)*toP < 2) {
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      pbVar3 = (byte *)*toP;
      *toP = (char *)(pbVar3 + 1);
      *pbVar3 = (byte)((int)(uint)bVar1 >> 6) | 0xc0;
      pbVar3 = (byte *)*toP;
      *toP = (char *)(pbVar3 + 1);
      *pbVar3 = bVar1 & 0x3f | 0x80;
      *fromP = *fromP + 1;
    }
    if (*toP == toLim) break;
    pcVar4 = *fromP;
    *fromP = pcVar4 + 1;
    cVar2 = *pcVar4;
    pcVar4 = *toP;
    *toP = pcVar4 + 1;
    *pcVar4 = cVar2;
  }
  return XML_CONVERT_OUTPUT_EXHAUSTED;
}

Assistant:

static enum XML_Convert_Result PTRCALL
latin1_toUtf8(const ENCODING *UNUSED_P(enc),
              const char **fromP, const char *fromLim,
              char **toP, const char *toLim)
{
  for (;;) {
    unsigned char c;
    if (*fromP == fromLim)
      return XML_CONVERT_COMPLETED;
    c = (unsigned char)**fromP;
    if (c & 0x80) {
      if (toLim - *toP < 2)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      *(*toP)++ = (char)((c >> 6) | UTF8_cval2);
      *(*toP)++ = (char)((c & 0x3f) | 0x80);
      (*fromP)++;
    }
    else {
      if (*toP == toLim)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      *(*toP)++ = *(*fromP)++;
    }
  }
}